

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O3

PoolHandle __thiscall TimerPool::Create(TimerPool *this,string *name)

{
  TimerPool *this_00;
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  PoolHandle PVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb8);
  (((element_type *)_Var2._M_pi)->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x100000001;
  ((element_type *)_Var2._M_pi)->_vptr_TimerPool =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00109b70;
  this_00 = (TimerPool *)
            &(((element_type *)_Var2._M_pi)->super_enable_shared_from_this<TimerPool>)._M_weak_this.
             super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  TimerPool(this_00,name);
  (((element_type *)_Var2._M_pi)->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TimerPool_00109bc0;
  lVar1 = *(long *)((long)&(((element_type *)_Var2._M_pi)->m_mutex).super___mutex_base._M_mutex + 8)
  ;
  if ((lVar1 == 0) || (_Var3._M_pi = extraout_RDX, *(int *)(lVar1 + 8) == 0)) {
    (((element_type *)_Var2._M_pi)->m_mutex).super___mutex_base._M_mutex.__align = (long)this_00;
    a_Stack_30[0]._M_pi = _Var2._M_pi;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((element_type *)_Var2._M_pi)->m_mutex).super___mutex_base._M_mutex + 8),
               a_Stack_30);
    _Var3._M_pi = extraout_RDX_00;
    _Var2._M_pi = a_Stack_30[0]._M_pi;
  }
  this->_vptr_TimerPool = (_func_int **)this_00;
  (this->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var2._M_pi;
  PVar4.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  PVar4.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PoolHandle)PVar4.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::PoolHandle TimerPool::Create(const std::string& name)
{
    return std::make_shared<EnableConstructor<TimerPool>>(name);
}